

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 fts5GetU64(u8 *a)

{
  return (ulong)a[7] +
         ((ulong)a[6] << 8 |
         (ulong)a[5] << 0x10 |
         (ulong)a[4] << 0x18 |
         (ulong)a[3] << 0x20 | (ulong)a[2] << 0x28 | (ulong)a[1] << 0x30 | (ulong)*a << 0x38);
}

Assistant:

static u64 fts5GetU64(u8 *a){
  return ((u64)a[0] << 56)
       + ((u64)a[1] << 48)
       + ((u64)a[2] << 40)
       + ((u64)a[3] << 32)
       + ((u64)a[4] << 24)
       + ((u64)a[5] << 16)
       + ((u64)a[6] << 8)
       + ((u64)a[7] << 0);
}